

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::QLineEdit(QLineEdit *this,QWidget *parent)

{
  long lVar1;
  QWidget *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLineEdit *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x5c36f9);
  QLineEdit(in_stack_ffffffffffffffe0,in_RDI,in_RSI);
  QString::~QString((QString *)0x5c3717);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLineEdit::QLineEdit(QWidget* parent)
    : QLineEdit(QString(), parent)
{
}